

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpki.c
# Opt level: O0

size_t bpkiEdataEnc(octet *epki,octet *edata,size_t edata_len,octet *salt,size_t iter)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  size_t sVar17;
  size_t sVar18;
  octet *poVar19;
  size_t sVar20;
  size_t sVar21;
  der_anchor_t *anchor;
  size_t sVar22;
  size_t sVar23;
  size_t sVar24;
  long in_RDI;
  size_t t_22;
  size_t t_21;
  size_t t_20;
  size_t t_19;
  size_t t_18;
  size_t t_17;
  size_t t_16;
  size_t t_15;
  size_t t_14;
  size_t t_13;
  size_t t_12;
  size_t t_11;
  size_t t_10;
  size_t t_9;
  size_t t_8;
  size_t t_7;
  size_t t_6;
  size_t t_5;
  size_t t_4;
  size_t t_3;
  size_t t_2;
  size_t t_1;
  size_t t;
  size_t count;
  der_anchor_t BeltKwpAlgId [1];
  der_anchor_t PrfAlgId [1];
  der_anchor_t PBKDF2_params [1];
  der_anchor_t PBKDF2AlgId [1];
  der_anchor_t PBES2_params [1];
  der_anchor_t EncryptionAlgId [1];
  der_anchor_t EPKI [1];
  size_t in_stack_fffffffffffffd78;
  octet *in_stack_fffffffffffffd80;
  der_anchor_t *in_stack_fffffffffffffd88;
  char *in_stack_fffffffffffffd90;
  der_anchor_t *in_stack_fffffffffffffd98;
  der_anchor_t *anchor_00;
  size_t in_stack_fffffffffffffda0;
  octet *pos;
  octet *in_stack_fffffffffffffda8;
  octet *der;
  undefined8 in_stack_fffffffffffffdb0;
  u32 uVar25;
  octet *in_stack_fffffffffffffdb8;
  long local_240;
  long local_238;
  long local_230;
  long local_228;
  long local_220;
  long local_218;
  long local_210;
  long local_208;
  long local_200;
  long local_1f8;
  long local_1f0;
  long local_1e8;
  long local_1e0;
  long local_1d8;
  long local_1d0;
  
  uVar25 = (u32)((ulong)in_stack_fffffffffffffdb0 >> 0x20);
  sVar1 = derTSEQEncStart(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                          in_stack_fffffffffffffd78,0);
  if (in_RDI == 0) {
    local_1d0 = 0;
  }
  else {
    local_1d0 = in_RDI + sVar1;
  }
  sVar2 = derTSEQEncStart(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                          in_stack_fffffffffffffd78,0);
  if (local_1d0 == 0) {
    local_1d8 = 0;
  }
  else {
    local_1d8 = local_1d0 + sVar2;
  }
  sVar3 = derOIDEnc((octet *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  if (local_1d8 == 0) {
    local_1e0 = 0;
  }
  else {
    local_1e0 = local_1d8 + sVar3;
  }
  sVar4 = derTSEQEncStart(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                          in_stack_fffffffffffffd78,0);
  if (local_1e0 == 0) {
    local_1e8 = 0;
  }
  else {
    local_1e8 = local_1e0 + sVar4;
  }
  sVar5 = derTSEQEncStart(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                          in_stack_fffffffffffffd78,0);
  if (local_1e8 == 0) {
    local_1f0 = 0;
  }
  else {
    local_1f0 = local_1e8 + sVar5;
  }
  sVar6 = derOIDEnc((octet *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  if (local_1f0 == 0) {
    local_1f8 = 0;
  }
  else {
    local_1f8 = local_1f0 + sVar6;
  }
  sVar7 = derTSEQEncStart(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                          in_stack_fffffffffffffd78,0);
  if (local_1f8 == 0) {
    local_200 = 0;
  }
  else {
    local_200 = local_1f8 + sVar7;
  }
  sVar8 = derEnc((octet *)in_stack_fffffffffffffd98,(u32)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                 in_stack_fffffffffffffd88,(size_t)in_stack_fffffffffffffd80);
  if (local_200 == 0) {
    local_208 = 0;
  }
  else {
    local_208 = local_200 + sVar8;
  }
  sVar9 = derTSIZEEnc(in_stack_fffffffffffffdb8,uVar25,(size_t)in_stack_fffffffffffffda8);
  if (local_208 == 0) {
    local_210 = 0;
  }
  else {
    local_210 = local_208 + sVar9;
  }
  sVar10 = derTSEQEncStart(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                           in_stack_fffffffffffffd78,0);
  if (local_210 == 0) {
    local_218 = 0;
  }
  else {
    local_218 = local_210 + sVar10;
  }
  sVar11 = derOIDEnc((octet *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  if (local_218 == 0) {
    local_220 = 0;
  }
  else {
    local_220 = local_218 + sVar11;
  }
  sVar12 = derEnc((octet *)in_stack_fffffffffffffd98,(u32)((ulong)in_stack_fffffffffffffd90 >> 0x20)
                  ,in_stack_fffffffffffffd88,(size_t)in_stack_fffffffffffffd80);
  if (local_220 == 0) {
    local_228 = 0;
  }
  else {
    local_228 = local_220 + sVar12;
  }
  sVar13 = derTSEQEncStop(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                          in_stack_fffffffffffffd98);
  if (local_228 == 0) {
    local_230 = 0;
  }
  else {
    local_230 = local_228 + sVar13;
  }
  sVar14 = derTSEQEncStop(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                          in_stack_fffffffffffffd98);
  if (local_230 == 0) {
    local_238 = 0;
  }
  else {
    local_238 = local_230 + sVar14;
  }
  sVar15 = derTSEQEncStop(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                          in_stack_fffffffffffffd98);
  if (local_238 == 0) {
    local_240 = 0;
  }
  else {
    local_240 = local_238 + sVar15;
  }
  sVar16 = derTSEQEncStart(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                           in_stack_fffffffffffffd78,0);
  if (local_240 == 0) {
    local_240 = 0;
  }
  else {
    local_240 = local_240 + sVar16;
  }
  sVar17 = derOIDEnc((octet *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  if (local_240 == 0) {
    local_240 = 0;
  }
  else {
    local_240 = local_240 + sVar17;
  }
  sVar18 = derEnc((octet *)in_stack_fffffffffffffd98,(u32)((ulong)in_stack_fffffffffffffd90 >> 0x20)
                  ,in_stack_fffffffffffffd88,(size_t)in_stack_fffffffffffffd80);
  if (local_240 == 0) {
    poVar19 = (octet *)0x0;
  }
  else {
    poVar19 = (octet *)(local_240 + sVar18);
  }
  der = poVar19;
  sVar20 = derTSEQEncStop(poVar19,in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  if (poVar19 == (octet *)0x0) {
    poVar19 = (octet *)0x0;
  }
  else {
    poVar19 = poVar19 + sVar20;
  }
  pos = poVar19;
  sVar21 = derTSEQEncStop(der,(size_t)poVar19,in_stack_fffffffffffffd98);
  if (poVar19 == (octet *)0x0) {
    anchor = (der_anchor_t *)0x0;
  }
  else {
    anchor = (der_anchor_t *)(poVar19 + sVar21);
  }
  anchor_00 = anchor;
  sVar22 = derTSEQEncStop(der,(size_t)pos,anchor);
  if (anchor == (der_anchor_t *)0x0) {
    uVar25 = 0;
  }
  else {
    uVar25 = (u32)((long)&anchor->der + sVar22 >> 0x20);
  }
  sVar23 = derEnc((octet *)anchor_00,uVar25,in_stack_fffffffffffffd88,
                  (size_t)in_stack_fffffffffffffd80);
  sVar24 = derTSEQEncStop(der,(size_t)pos,anchor_00);
  return sVar24 + sVar23 + sVar22 + sVar21 + sVar20 + sVar18 + sVar17 + sVar16 + sVar15 + sVar14 + 
                                                  sVar13 + sVar12 + sVar11 + sVar10 + sVar9 + sVar8 
                                                  + sVar7 + sVar6 + sVar5 + sVar4 + sVar3 + sVar2 + 
                                                  sVar1;
}

Assistant:

static size_t bpkiEdataEnc(octet epki[], const octet edata[], size_t edata_len,
	const octet salt[8], size_t iter)
{
	der_anchor_t EPKI[1];
	der_anchor_t EncryptionAlgId[1];
	der_anchor_t PBES2_params[1];
	der_anchor_t PBKDF2AlgId[1];
	der_anchor_t PBKDF2_params[1];
	der_anchor_t PrfAlgId[1];
	der_anchor_t BeltKwpAlgId[1];
	size_t count = 0;
	// кодировать
	derEncStep(derSEQEncStart(EPKI, epki, count), epki, count);
	 derEncStep(derSEQEncStart(EncryptionAlgId, epki, count), epki, count);
	  derEncStep(derOIDEnc(epki, oid_id_pbes2), epki, count);
	  derEncStep(derSEQEncStart(PBES2_params, epki, count), epki, count);
	   derEncStep(derSEQEncStart(PBKDF2AlgId, epki, count), epki, count);
	    derEncStep(derOIDEnc(epki, oid_id_pbkdf2), epki, count);
	    derEncStep(derSEQEncStart(PBKDF2_params, epki, count), epki, count);
	     derEncStep(derOCTEnc(epki, salt, 8), epki, count);
		 derEncStep(derSIZEEnc(epki, iter), epki, count);
		 derEncStep(derSEQEncStart(PrfAlgId, epki, count), epki, count);
		  derEncStep(derOIDEnc(epki, oid_hmac_hbelt), epki, count);
		  derEncStep(derNULLEnc(epki), epki, count);
		 derEncStep(derSEQEncStop(epki, count, PrfAlgId), epki, count);
		derEncStep(derSEQEncStop(epki, count, PBKDF2_params), epki, count);
	   derEncStep(derSEQEncStop(epki, count, PBKDF2AlgId), epki, count);
	   derEncStep(derSEQEncStart(BeltKwpAlgId, epki, count), epki, count);
	    derEncStep(derOIDEnc(epki, oid_belt_kwp256), epki, count);
	    derEncStep(derNULLEnc(epki), epki, count);
	  derEncStep(derSEQEncStop(epki, count, BeltKwpAlgId), epki, count);
	  derEncStep(derSEQEncStop(epki, count, PBES2_params), epki, count);
	  derEncStep(derSEQEncStop(epki, count, EncryptionAlgId), epki, count);
	 derEncStep(derOCTEnc(epki, edata, edata_len), epki, count);
	derEncStep(derSEQEncStop(epki, count, EPKI), epki, count);
	// возвратить длину DER-кода
	return count;
}